

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample_bicubic_apply_interpolation.h
# Opt level: O1

void ncnn::gridsample_2d_bicubic_apply_interpolation_p8
               (Mat *src,Mat *dst,Mat *offset_value,Option *opt)

{
  float *pfVar1;
  int iVar2;
  void *pvVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  int iVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  undefined1 (*pauVar14) [32];
  float *pfVar15;
  long lVar16;
  long lVar17;
  undefined1 auVar18 [32];
  float fVar19;
  float fVar24;
  float fVar25;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined1 auVar31 [32];
  float fVar32;
  float fVar34;
  float fVar35;
  undefined1 auVar33 [16];
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar41 [28];
  __m256 value_f [4];
  float local_c0;
  float fStack_bc;
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  float local_a0;
  float fStack_9c;
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  float local_80;
  float fStack_7c;
  float fStack_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float fStack_68;
  float local_60;
  float fStack_5c;
  float fStack_58;
  float fStack_54;
  float fStack_50;
  float fStack_4c;
  float fStack_48;
  
  iVar2 = dst->c;
  if (0 < (long)iVar2) {
    iVar10 = dst->h * dst->w;
    lVar12 = 0;
    do {
      if (0 < iVar10) {
        lVar13 = src->cstep * lVar12 * src->elemsize;
        pvVar3 = src->data;
        pfVar15 = (float *)offset_value->data;
        pauVar14 = (undefined1 (*) [32])(dst->cstep * lVar12 * dst->elemsize + (long)dst->data);
        iVar11 = 0;
        do {
          fVar19 = *pfVar15;
          fVar24 = pfVar15[1];
          fVar25 = fVar19 + 1.0;
          fVar27 = 1.0 - fVar19;
          fVar25 = ((fVar25 * -0.75 + 3.75) * fVar25 + -6.0) * fVar25 + 3.0;
          auVar4 = vshufps_avx(ZEXT416((uint)fVar25),ZEXT416((uint)fVar25),0);
          fVar26 = (fVar19 * 1.25 + -2.25) * fVar19 * fVar19;
          auVar33 = ZEXT416((uint)(fVar26 + 1.0));
          auVar33 = vshufps_avx(auVar33,auVar33,0);
          fVar19 = (fVar27 * 1.25 + -2.25) * fVar27 * fVar27 + 1.0;
          auVar5 = vshufps_avx(ZEXT416((uint)fVar19),ZEXT416((uint)fVar19),0);
          auVar20 = ZEXT416((uint)(fVar25 + fVar19 + fVar26));
          auVar20 = vshufps_avx(auVar20,auVar20,0);
          fVar19 = fVar24 + 1.0;
          fVar25 = 1.0 - fVar24;
          auVar21 = ZEXT416((uint)(((3.75 - fVar19 * 0.75) * fVar19 + -6.0) * fVar19));
          auVar21 = vshufps_avx(auVar21,auVar21,0);
          fVar24 = (fVar24 * 1.25 + -2.25) * fVar24 * fVar24;
          auVar6 = vshufps_avx(ZEXT416((uint)fVar24),ZEXT416((uint)fVar24),0);
          fVar19 = fVar25 * fVar25 * (fVar25 * 1.25 + -2.25) + 1.0;
          auVar7 = vshufps_avx(ZEXT416((uint)fVar19),ZEXT416((uint)fVar19),0);
          auVar8 = vshufps_avx(ZEXT416((uint)(fVar19 + fVar24)),ZEXT416((uint)(fVar19 + fVar24)),0);
          lVar16 = 0;
          do {
            lVar17 = (long)*(int *)((long)pfVar15 + lVar16 + 8);
            fVar25 = 0.0;
            fVar26 = 0.0;
            fVar19 = 0.0;
            fVar24 = 0.0;
            fVar27 = 0.0;
            fVar28 = 0.0;
            fVar29 = 0.0;
            fVar30 = 0.0;
            fVar35 = 0.0;
            fVar36 = 0.0;
            fVar32 = 0.0;
            fVar34 = 0.0;
            fVar37 = 0.0;
            fVar38 = 0.0;
            fVar39 = 0.0;
            fVar40 = 0.0;
            if (-1 < lVar17) {
              pfVar1 = (float *)((long)pvVar3 + lVar17 * 4 + lVar13);
              fVar32 = *pfVar1;
              fVar34 = pfVar1[1];
              fVar35 = pfVar1[2];
              fVar36 = pfVar1[3];
              fVar37 = pfVar1[4];
              fVar38 = pfVar1[5];
              fVar39 = pfVar1[6];
              fVar40 = pfVar1[7];
            }
            lVar17 = (long)*(int *)((long)pfVar15 + lVar16 + 0xc);
            if (-1 < lVar17) {
              pfVar1 = (float *)((long)pvVar3 + lVar17 * 4 + lVar13);
              fVar19 = *pfVar1;
              fVar24 = pfVar1[1];
              fVar25 = pfVar1[2];
              fVar26 = pfVar1[3];
              fVar27 = pfVar1[4];
              fVar28 = pfVar1[5];
              fVar29 = pfVar1[6];
              fVar30 = pfVar1[7];
            }
            lVar17 = (long)*(int *)((long)pfVar15 + lVar16 + 0x10);
            auVar22 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar41 = ZEXT1628(ZEXT816(0) << 0x40);
            if (-1 < lVar17) {
              auVar41 = SUB3228(*(undefined1 (*) [32])((long)pvVar3 + lVar17 * 4 + lVar13),0);
            }
            lVar17 = (long)*(int *)((long)pfVar15 + lVar16 + 0x14);
            if (-1 < lVar17) {
              auVar22 = ZEXT3264(*(undefined1 (*) [32])((long)pvVar3 + lVar17 * 4 + lVar13));
            }
            auVar23._0_4_ = auVar20._0_4_ * auVar22._0_4_;
            auVar23._4_4_ = auVar20._4_4_ * auVar22._4_4_;
            auVar23._8_4_ = auVar20._8_4_ * auVar22._8_4_;
            auVar23._12_4_ = auVar20._12_4_ * auVar22._12_4_;
            auVar23._16_4_ = auVar20._0_4_ * auVar22._16_4_;
            auVar23._20_4_ = auVar20._4_4_ * auVar22._20_4_;
            auVar23._28_36_ = auVar22._28_36_;
            auVar23._24_4_ = auVar20._8_4_ * auVar22._24_4_;
            auVar31._0_4_ =
                 auVar41._0_4_ * auVar5._0_4_ + fVar32 * auVar4._0_4_ + auVar33._0_4_ * fVar19;
            auVar31._4_4_ =
                 auVar41._4_4_ * auVar5._4_4_ + fVar34 * auVar4._4_4_ + auVar33._4_4_ * fVar24;
            auVar31._8_4_ =
                 auVar41._8_4_ * auVar5._8_4_ + fVar35 * auVar4._8_4_ + auVar33._8_4_ * fVar25;
            auVar31._12_4_ =
                 auVar41._12_4_ * auVar5._12_4_ + fVar36 * auVar4._12_4_ + auVar33._12_4_ * fVar26;
            auVar31._16_4_ =
                 auVar41._16_4_ * auVar5._0_4_ + fVar37 * auVar4._0_4_ + auVar33._0_4_ * fVar27;
            auVar31._20_4_ =
                 auVar41._20_4_ * auVar5._4_4_ + fVar38 * auVar4._4_4_ + auVar33._4_4_ * fVar28;
            auVar31._24_4_ =
                 auVar41._24_4_ * auVar5._8_4_ + fVar39 * auVar4._8_4_ + auVar33._8_4_ * fVar29;
            auVar31._28_4_ = fVar40 + fVar40 + fVar30;
            auVar31 = vsubps_avx(auVar31,auVar23._0_32_);
            *(undefined1 (*) [32])((long)&local_c0 + lVar16 * 2) = auVar31;
            lVar16 = lVar16 + 0x10;
          } while (lVar16 != 0x40);
          fVar19 = auVar21._0_4_ + 3.0;
          fVar24 = auVar21._4_4_ + 3.0;
          fVar25 = auVar21._8_4_ + 3.0;
          fVar26 = auVar21._12_4_ + 3.0;
          fVar27 = auVar21._0_4_ + 3.0;
          fVar28 = auVar21._4_4_ + 3.0;
          fVar29 = auVar21._8_4_ + 3.0;
          fVar30 = auVar6._12_4_ + 1.0 + auVar21._12_4_ + 3.0;
          auVar18._0_4_ =
               (auVar6._0_4_ + 1.0) * local_a0 + fVar19 * local_c0 + auVar7._0_4_ * local_80;
          auVar18._4_4_ =
               (auVar6._4_4_ + 1.0) * fStack_9c + fVar24 * fStack_bc + auVar7._4_4_ * fStack_7c;
          auVar18._8_4_ =
               (auVar6._8_4_ + 1.0) * fStack_98 + fVar25 * fStack_b8 + auVar7._8_4_ * fStack_78;
          auVar18._12_4_ =
               (auVar6._12_4_ + 1.0) * fStack_94 + fVar26 * fStack_b4 + auVar7._12_4_ * fStack_74;
          auVar18._16_4_ =
               (auVar6._0_4_ + 1.0) * fStack_90 + fVar27 * fStack_b0 + auVar7._0_4_ * fStack_70;
          auVar18._20_4_ =
               (auVar6._4_4_ + 1.0) * fStack_8c + fVar28 * fStack_ac + auVar7._4_4_ * fStack_6c;
          auVar18._24_4_ =
               (auVar6._8_4_ + 1.0) * fStack_88 + fVar29 * fStack_a8 + auVar7._8_4_ * fStack_68;
          auVar18._28_4_ = fVar30 + auVar7._12_4_;
          auVar9._4_4_ = (fVar24 + auVar8._4_4_) * fStack_5c;
          auVar9._0_4_ = (fVar19 + auVar8._0_4_) * local_60;
          auVar9._8_4_ = (fVar25 + auVar8._8_4_) * fStack_58;
          auVar9._12_4_ = (fVar26 + auVar8._12_4_) * fStack_54;
          auVar9._16_4_ = (fVar27 + auVar8._0_4_) * fStack_50;
          auVar9._20_4_ = (fVar28 + auVar8._4_4_) * fStack_4c;
          auVar9._24_4_ = (fVar29 + auVar8._8_4_) * fStack_48;
          auVar9._28_4_ = fVar30;
          auVar31 = vsubps_avx(auVar18,auVar9);
          *pauVar14 = auVar31;
          pauVar14 = pauVar14 + 1;
          pfVar15 = pfVar15 + 0x12;
          iVar11 = iVar11 + 1;
        } while (iVar11 != iVar10);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 != iVar2);
  }
  return;
}

Assistant:

static void gridsample_2d_bicubic_apply_interpolation_p8(const Mat& src, Mat& dst, Mat& offset_value, const Option& opt)
{
    const int channels = dst.c;
    const int outw = dst.w;
    const int outh = dst.h;
    const int grid_size = outw * outh;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* srcptr = src.channel(q);
        float* dstptr = dst.channel(q);

        const float* offset_value_ptr = offset_value.channel(0);

        for (int i = 0; i < grid_size; i++)
        {
            __m256 x_coeffs0, x_coeffs1, x_coeffs2, x_coeffs3;
            __m256 y_coeffs0, y_coeffs1, y_coeffs2, y_coeffs3;
            __m256 value_f[4];
            cubic_interp1d_p8(x_coeffs0, x_coeffs1, x_coeffs2, x_coeffs3, _mm256_set1_ps(offset_value_ptr[0]));
            cubic_interp1d_p8(y_coeffs0, y_coeffs1, y_coeffs2, y_coeffs3, _mm256_set1_ps(offset_value_ptr[1]));

            const int* offset_ptr = (int*)offset_value_ptr + 2;

            for (int ii = 0; ii < 4; ii++)
            {
                __m256 x0_val = offset_ptr[0] >= 0 ? _mm256_loadu_ps(srcptr + offset_ptr[0]) : _mm256_set1_ps(0);
                __m256 x1_val = offset_ptr[1] >= 0 ? _mm256_loadu_ps(srcptr + offset_ptr[1]) : _mm256_set1_ps(0);
                __m256 x2_val = offset_ptr[2] >= 0 ? _mm256_loadu_ps(srcptr + offset_ptr[2]) : _mm256_set1_ps(0);
                __m256 x3_val = offset_ptr[3] >= 0 ? _mm256_loadu_ps(srcptr + offset_ptr[3]) : _mm256_set1_ps(0);

                value_f[ii] = _mm256_mul_ps(x_coeffs0, x0_val);
                value_f[ii] = _mm256_comp_fmadd_ps(x_coeffs1, x1_val, value_f[ii]);
                value_f[ii] = _mm256_comp_fmadd_ps(x_coeffs2, x2_val, value_f[ii]);
                value_f[ii] = _mm256_comp_fmadd_ps(x_coeffs3, x3_val, value_f[ii]);

                offset_ptr += 4;
            }

            __m256 _v = _mm256_mul_ps(y_coeffs0, value_f[0]);
            _v = _mm256_comp_fmadd_ps(y_coeffs1, value_f[1], _v);
            _v = _mm256_comp_fmadd_ps(y_coeffs2, value_f[2], _v);
            _v = _mm256_comp_fmadd_ps(y_coeffs3, value_f[3], _v);
            _mm256_storeu_ps(dstptr, _v);

            dstptr += 8;
            offset_value_ptr += 18;
        }
    }
}